

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# njd_node.c
# Opt level: O3

void NJDNode_set_chain_rule(NJDNode *node,char *str)

{
  char *pcVar1;
  
  if (node->chain_rule != (char *)0x0) {
    free(node->chain_rule);
  }
  if ((str == (char *)0x0) || (*str == '\0')) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = strdup(str);
  }
  node->chain_rule = pcVar1;
  return;
}

Assistant:

void NJDNode_set_chain_rule(NJDNode * node, const char *str)
{
   if (node->chain_rule != NULL)
      free(node->chain_rule);
   if (str == NULL || strlen(str) == 0)
      node->chain_rule = NULL;
   else
      node->chain_rule = strdup(str);
}